

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tasdreamOptimizationTests.cpp
# Opt level: O2

void TasOptimization::makeNesterovTestFunction
               (double L,int k,ObjectiveFunctionSingle *func,GradientFunctionSingle *grad,
               vector<double,_std::allocator<double>_> *minimum)

{
  pointer pdVar1;
  pointer pdVar2;
  ulong uVar3;
  pointer pdVar4;
  ulong uVar5;
  _Any_data local_48;
  _Manager_type local_38;
  _Invoker_type p_Stack_30;
  
  local_48._M_unused._0_8_ = (undefined8)*(undefined8 *)&(func->super__Function_base)._M_functor;
  local_48._8_8_ = *(undefined8 *)((long)&(func->super__Function_base)._M_functor + 8);
  *(double *)&(func->super__Function_base)._M_functor = L;
  *(int *)((long)&(func->super__Function_base)._M_functor + 8) = k;
  local_38 = (func->super__Function_base)._M_manager;
  p_Stack_30 = (_Invoker_type)func->_M_invoker;
  (func->super__Function_base)._M_manager =
       std::
       _Function_handler<double_(const_std::vector<double,_std::allocator<double>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/mkstoyanov[P]TASMANIAN/DREAM/Optimization/tasdreamOptimizationTests.cpp:249:12)>
       ::_M_manager;
  func->_M_invoker =
       std::
       _Function_handler<double_(const_std::vector<double,_std::allocator<double>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/mkstoyanov[P]TASMANIAN/DREAM/Optimization/tasdreamOptimizationTests.cpp:249:12)>
       ::_M_invoke;
  std::_Function_base::~_Function_base((_Function_base *)&local_48);
  local_48._M_unused._0_8_ = (undefined8)*(undefined8 *)&(grad->super__Function_base)._M_functor;
  local_48._8_8_ = *(undefined8 *)((long)&(grad->super__Function_base)._M_functor + 8);
  *(double *)&(grad->super__Function_base)._M_functor = L;
  *(int *)((long)&(grad->super__Function_base)._M_functor + 8) = k;
  local_38 = (grad->super__Function_base)._M_manager;
  p_Stack_30 = grad->_M_invoker;
  (grad->super__Function_base)._M_manager =
       std::
       _Function_handler<void_(const_std::vector<double,_std::allocator<double>_>_&,_std::vector<double,_std::allocator<double>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/mkstoyanov[P]TASMANIAN/DREAM/Optimization/tasdreamOptimizationTests.cpp:258:12)>
       ::_M_manager;
  grad->_M_invoker =
       std::
       _Function_handler<void_(const_std::vector<double,_std::allocator<double>_>_&,_std::vector<double,_std::allocator<double>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/mkstoyanov[P]TASMANIAN/DREAM/Optimization/tasdreamOptimizationTests.cpp:258:12)>
       ::_M_invoke;
  std::_Function_base::~_Function_base((_Function_base *)&local_48);
  pdVar1 = (minimum->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pdVar2 = (minimum->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  for (pdVar4 = pdVar1 + k; pdVar4 != pdVar2; pdVar4 = pdVar4 + 1) {
    *pdVar4 = 0.0;
  }
  uVar3 = 0;
  uVar5 = (ulong)(uint)k;
  if (k < 1) {
    uVar5 = uVar3;
  }
  while (uVar5 != uVar3) {
    pdVar1[uVar3] = 1.0 - (double)(int)(uVar3 + 1) / ((double)k + 1.0);
    uVar3 = uVar3 + 1;
  }
  return;
}

Assistant:

void makeNesterovTestFunction(const double L, const int k, ObjectiveFunctionSingle &func, GradientFunctionSingle &grad,
                              std::vector<double> &minimum) {
    func = [=](const std::vector<double> &x)->double {
        double result = (L / 4.0) * ((1.0 / 2.0) * (x[0] * x[0] + x[k-1] * x[k-1]) - x[0]);
        double delta;
        for (int i=0; i<k-1; i++) {
            delta = x[i] - x[i+1];
            result += (L / 8.0) * (delta * delta);
        }
        return result;
    };
    grad = [=](const std::vector<double> &x, std::vector<double> &gx)->void {
        std::fill(gx.begin(), gx.end(), 0);
        gx[0] = (L / 4.0) * (x[0] - 1.0);
        gx[k-1] = (L / 4.0) * x[k-1];
        for (int i=0; i<k-1; i++) {
            gx[i] += (L / 4.0) * (x[i] - x[i+1]);
            gx[i+1] -= (L / 4.0) * (x[i] - x[i+1]);
        }
    };
    std::fill(minimum.begin() + k, minimum.end(), 0);
    for (int i=0; i<k; i++) {
        minimum[i] = 1.0 - ((double) i + 1.0) / (k + 1.0);
    }
}